

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_bad_scalar(void)

{
  int iVar1;
  secp256k1_pubkey point;
  secp256k1_scalar rand;
  uchar output [32];
  uchar s_rand [32];
  uchar s_overflow [32];
  uchar s_zero [32];
  secp256k1_scalar *in_stack_ffffffffffffff18;
  uchar *in_stack_ffffffffffffff20;
  secp256k1_scalar *in_stack_ffffffffffffff40;
  undefined1 local_68 [16];
  uchar *in_stack_ffffffffffffffa8;
  secp256k1_pubkey *in_stack_ffffffffffffffb0;
  secp256k1_context *ctx;
  undefined1 local_28 [40];
  
  memset(local_28,0,0x20);
  ctx = (secp256k1_context *)0xffffffffffffffff;
  memset(local_68,0,0x20);
  random_scalar_order(in_stack_ffffffffffffff40);
  secp256k1_scalar_get_b32(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  iVar1 = secp256k1_ec_pubkey_create(ctx,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x71,"test condition failed: secp256k1_ec_pubkey_create(CTX, &point, s_rand) == 1");
    abort();
  }
  iVar1 = secp256k1_ecdh((secp256k1_context *)s_overflow._8_8_,(uchar *)s_overflow._0_8_,
                         (secp256k1_pubkey *)s_rand._24_8_,(uchar *)s_rand._16_8_,
                         (secp256k1_ecdh_hash_function)s_rand._8_8_,(void *)s_rand._0_8_);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x74,
            "test condition failed: secp256k1_ecdh(CTX, output, &point, s_zero, NULL, NULL) == 0");
    abort();
  }
  iVar1 = secp256k1_ecdh((secp256k1_context *)s_overflow._8_8_,(uchar *)s_overflow._0_8_,
                         (secp256k1_pubkey *)s_rand._24_8_,(uchar *)s_rand._16_8_,
                         (secp256k1_ecdh_hash_function)s_rand._8_8_,(void *)s_rand._0_8_);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x75,
            "test condition failed: secp256k1_ecdh(CTX, output, &point, s_overflow, NULL, NULL) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_ecdh((secp256k1_context *)s_overflow._8_8_,(uchar *)s_overflow._0_8_,
                         (secp256k1_pubkey *)s_rand._24_8_,(uchar *)s_rand._16_8_,
                         (secp256k1_ecdh_hash_function)s_rand._8_8_,(void *)s_rand._0_8_);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x78,
            "test condition failed: secp256k1_ecdh(CTX, output, &point, s_overflow, NULL, NULL) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ecdh((secp256k1_context *)s_overflow._8_8_,(uchar *)s_overflow._0_8_,
                         (secp256k1_pubkey *)s_rand._24_8_,(uchar *)s_rand._16_8_,
                         (secp256k1_ecdh_hash_function)s_rand._8_8_,(void *)s_rand._0_8_);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x7b,
            "test condition failed: secp256k1_ecdh(CTX, output, &point, s_overflow, ecdh_hash_function_test_fail, NULL) == 0"
           );
    abort();
  }
  return;
}

Assistant:

static void test_bad_scalar(void) {
    unsigned char s_zero[32] = { 0 };
    unsigned char s_overflow[32] = {
        0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
        0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
        0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
        0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41
    };
    unsigned char s_rand[32] = { 0 };
    unsigned char output[32];
    secp256k1_scalar rand;
    secp256k1_pubkey point;

    /* Create random point */
    random_scalar_order(&rand);
    secp256k1_scalar_get_b32(s_rand, &rand);
    CHECK(secp256k1_ec_pubkey_create(CTX, &point, s_rand) == 1);

    /* Try to multiply it by bad values */
    CHECK(secp256k1_ecdh(CTX, output, &point, s_zero, NULL, NULL) == 0);
    CHECK(secp256k1_ecdh(CTX, output, &point, s_overflow, NULL, NULL) == 0);
    /* ...and a good one */
    s_overflow[31] -= 1;
    CHECK(secp256k1_ecdh(CTX, output, &point, s_overflow, NULL, NULL) == 1);

    /* Hash function failure results in ecdh failure */
    CHECK(secp256k1_ecdh(CTX, output, &point, s_overflow, ecdh_hash_function_test_fail, NULL) == 0);
}